

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPIfClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPIfClause *this)

{
  string clause_string;
  allocator<char> local_50 [8];
  ulong local_48;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"if ",local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"(",(allocator<char> *)&local_30);
  if (this->modifier < OMPC_IF_MODIFIER_unspecified) {
    std::__cxx11::string::append((char *)local_50);
  }
  if (1 < local_48) {
    std::__cxx11::string::append((char *)local_50);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_30,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)local_50);
  if (2 < local_48) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPIfClause::toString() {

    std::string result = "if ";
    std::string clause_string = "(";
    OpenMPIfClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_IF_MODIFIER_parallel:
            clause_string += "parallel";
            break;
        case OMPC_IF_MODIFIER_simd:
            clause_string += "simd";
            break;
        case OMPC_IF_MODIFIER_task:
            clause_string += "task";
            break;
        case OMPC_IF_MODIFIER_taskloop:
            clause_string += "taskloop";
            break;
        case OMPC_IF_MODIFIER_cancel:
            clause_string += "cancel";
            break;
        case OMPC_IF_MODIFIER_target_data:
            clause_string += "target data";
            break;
        case OMPC_IF_MODIFIER_target_enter_data:
            clause_string += "target enter data";
            break;
        case OMPC_IF_MODIFIER_target_exit_data:
            clause_string += "target exit data";
            break;
        case OMPC_IF_MODIFIER_target:
            clause_string += "target";
            break;
        case OMPC_IF_MODIFIER_target_update:
            clause_string += "target update";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += ": ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 2) {
        result += clause_string;
    };

    return result;
}